

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O3

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint _h;
  int *piVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  ulong local_68;
  
  iVar1 = bottom_blob->elempack;
  uVar15 = (ulong)iVar1;
  iVar10 = this->out_elempack;
  uVar17 = (ulong)iVar10;
  if (iVar1 != iVar10) {
    iVar2 = bottom_blob->w;
    lVar9 = (long)iVar2;
    _h = bottom_blob->h;
    iVar12 = bottom_blob->c;
    iVar13 = bottom_blob->dims;
    uVar4 = bottom_blob->elemsize;
    if (this->use_padding != 0) {
      if (iVar13 == 1) {
LAB_00168f2d:
        if (iVar10 == 1) {
          if (top_blob == bottom_blob) {
            iVar10 = 1;
          }
          else {
            piVar3 = bottom_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->c = 0;
            top_blob->cstep = 0;
            piVar3 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar3;
            top_blob->allocator = bottom_blob->allocator;
            top_blob->dims = bottom_blob->dims;
            iVar10 = bottom_blob->c;
            top_blob->h = bottom_blob->h;
            top_blob->c = iVar10;
            iVar10 = this->out_elempack;
          }
          top_blob->w = iVar1 * iVar2;
          top_blob->cstep = (long)(iVar1 * iVar2);
          top_blob->elemsize = uVar4 / uVar15;
          top_blob->elempack = iVar10;
          return 0;
        }
        Mat::create(top_blob,(iVar1 * iVar2 + iVar10 + -1) / iVar10,uVar17 * (uVar4 / uVar15),iVar10
                    ,opt->blob_allocator);
        if (top_blob->data != (void *)0x0) {
          if ((long)top_blob->c * top_blob->cstep != 0) {
            memcpy(top_blob->data,bottom_blob->data,uVar4 * lVar9);
            return 0;
          }
          return -100;
        }
        return -100;
      }
      if (iVar13 != 3) {
        if (iVar13 != 2) {
          return 0;
        }
LAB_00168d82:
        uVar8 = (long)(int)(iVar10 + iVar1 * _h + -1) / (long)iVar10;
        sVar16 = (uVar4 / uVar15) * uVar17;
        uVar17 = sVar16 / uVar17;
        iVar12 = (int)uVar8;
        Mat::create(top_blob,iVar2,iVar12,sVar16,iVar10,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (iVar12 < 1) {
          return 0;
        }
        uVar15 = 0;
        do {
          if (0 < iVar2) {
            pvVar5 = top_blob->data;
            uVar14 = (ulong)(uint)this->out_elempack;
            lVar11 = 0;
            do {
              if (0 < (int)uVar14) {
                lVar18 = 0;
                do {
                  iVar12 = (int)uVar15 * (int)uVar14 + (int)lVar18;
                  iVar10 = iVar12 / iVar1;
                  if ((int)_h <= iVar10) break;
                  memcpy((void *)((long)pvVar5 +
                                 uVar17 * lVar18 + sVar16 * lVar11 + uVar15 * sVar16 * lVar9),
                         (void *)((long)bottom_blob->data +
                                 (long)(iVar12 % iVar1) * uVar17 + uVar4 * lVar11 +
                                 (long)(iVar10 * iVar2) * uVar4),uVar17);
                  lVar18 = lVar18 + 1;
                  uVar14 = (ulong)this->out_elempack;
                } while (lVar18 < (long)uVar14);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar9);
          }
          uVar15 = uVar15 + 1;
          if (uVar15 == (uVar8 & 0xffffffff)) {
            return 0;
          }
        } while( true );
      }
LAB_00168f87:
      uVar8 = (long)(iVar10 + iVar12 * iVar1 + -1) / (long)iVar10;
      sVar16 = (uVar4 / uVar15) * uVar17;
      uVar17 = sVar16 / uVar17;
      iVar13 = (int)uVar8;
      Mat::create(top_blob,iVar2,_h,iVar13,sVar16,iVar10,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar13 < 1) {
        return 0;
      }
      uVar15 = 0;
      do {
        if (0 < (int)_h) {
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar5 = top_blob->data;
          local_68 = 0;
          do {
            if (0 < iVar2) {
              uVar14 = (ulong)(uint)this->out_elempack;
              lVar11 = 0;
              do {
                if (0 < (int)uVar14) {
                  lVar18 = 0;
                  do {
                    iVar13 = (int)uVar15 * (int)uVar14 + (int)lVar18;
                    iVar10 = iVar13 / iVar1;
                    if (iVar12 <= iVar10) break;
                    memcpy((void *)((long)pvVar5 +
                                   uVar17 * lVar18 +
                                   sVar16 * lVar11 +
                                   sVar16 * local_68 * lVar9 + sVar6 * uVar15 * sVar7),
                           (void *)((long)bottom_blob->data +
                                   (long)(iVar13 % iVar1) * uVar17 +
                                   uVar4 * lVar11 + local_68 * lVar9 * uVar4 +
                                   (long)iVar10 * bottom_blob->cstep * bottom_blob->elemsize),uVar17
                          );
                    lVar18 = lVar18 + 1;
                    uVar14 = (ulong)this->out_elempack;
                  } while (lVar18 < (long)uVar14);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != lVar9);
            }
            local_68 = local_68 + 1;
          } while (local_68 != _h);
        }
        uVar15 = uVar15 + 1;
        if (uVar15 == (uVar8 & 0xffffffff)) {
          return 0;
        }
      } while( true );
    }
    if (iVar13 == 3) {
      if ((iVar12 * iVar1) % iVar10 == 0) goto LAB_00168f87;
    }
    else if (iVar13 == 2) {
      if ((int)(iVar1 * _h) % iVar10 == 0) goto LAB_00168d82;
    }
    else {
      if (iVar13 != 1) {
        return 0;
      }
      if ((iVar2 * iVar1) % iVar10 == 0) goto LAB_00168f2d;
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar1 = bottom_blob->w;
    iVar10 = bottom_blob->h;
    iVar2 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar1;
    top_blob->h = iVar10;
    top_blob->c = iVar2;
    top_blob->cstep = bottom_blob->cstep;
  }
  return 0;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 3 && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}